

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O2

Matrix6x6 * __thiscall
iDynTree::SpatialMotionVector::asCrossProductMatrix
          (Matrix6x6 *__return_storage_ptr__,SpatialMotionVector *this)

{
  AngularVector3T *pAVar1;
  double *pdVar2;
  Matrix<double,_3,_3,_1,_3,_3> local_b0;
  undefined1 local_68 [32];
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> vStack_40;
  Index local_38;
  
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       -(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
        [2];
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  pAVar1 = &(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
  _0_4_ = *(undefined4 *)(pAVar1->super_Vector3).m_data;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
  _4_4_ = *(undefined4 *)
           ((long)(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                  super_Vector3.m_data + 4);
  pdVar2 = (this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
           m_data + 1;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *pdVar2;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -(pAVar1->super_Vector3).m_data[0];
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -*pdVar2;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_48.m_value = 0;
  vStack_40.m_value = 0;
  local_38 = 6;
  local_68._0_8_ = __return_storage_ptr__;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_b0);
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       -(this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
        [2];
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
  _0_4_ = *(undefined4 *)
           (this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
           m_data;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
  _4_4_ = *(undefined4 *)
           ((long)(this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                  super_Vector3.m_data + 4);
  pdVar2 = (this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
           m_data + 1;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *pdVar2;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -(this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
        [0];
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -*pdVar2;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_68._0_8_ = __return_storage_ptr__->m_data + 3;
  local_48.m_value = 0;
  vStack_40.m_value = 3;
  local_38 = 6;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_b0);
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)(__return_storage_ptr__->m_data + 0x12);
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)__return_storage_ptr__;
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
             *)&local_b0);
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       -(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
        [2];
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  pAVar1 = &(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
  _0_4_ = *(undefined4 *)(pAVar1->super_Vector3).m_data;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
  _4_4_ = *(undefined4 *)
           ((long)(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                  super_Vector3.m_data + 4);
  pdVar2 = (this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
           m_data + 1;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *pdVar2;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -(pAVar1->super_Vector3).m_data[0];
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -*pdVar2;
  local_b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_68._0_8_ = __return_storage_ptr__->m_data + 0x15;
  local_48.m_value = 3;
  vStack_40.m_value = 3;
  local_38 = 6;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_b0);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 SpatialMotionVector::asCrossProductMatrix() const
{
    Matrix6x6 res;

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(res.data());

    retEigen.block<3,3>(0,0) = skew(toEigen(this->angularVec3));
    retEigen.block<3,3>(0,3) = skew(toEigen(this->linearVec3));
    retEigen.block<3,3>(3,0).setZero();
    retEigen.block<3,3>(3,3) = skew(toEigen(this->angularVec3));

    return res;
}